

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O3

void __thiscall
t_dart_generator::generate_service_client(t_dart_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *os;
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  t_struct *ptVar4;
  int iVar5;
  long *plVar6;
  ostream *poVar7;
  t_function *ptVar8;
  size_type *psVar9;
  char *pcVar10;
  t_dart_generator *ptVar11;
  char *__end;
  pointer pptVar12;
  pointer pptVar13;
  string arg_field_name;
  string class_name;
  string result_field_name;
  string argsname;
  string extends;
  string extends_client;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_398;
  string local_378;
  string local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  pointer local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_310;
  size_type local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f0;
  size_type local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  char *local_2b0;
  long local_2a8;
  char local_2a0 [16];
  t_struct *local_290;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  vector<t_function_*,_std::allocator<t_function_*>_> local_208;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"","");
  local_2b0 = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"","");
  if (tservice->extends_ != (t_service *)0x0) {
    get_ttype_class_name_abi_cxx11_(&local_378,this,&tservice->extends_->super_t_type);
    std::__cxx11::string::operator=((string *)&local_2d0,(string *)&local_378);
    paVar2 = &local_378.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != paVar2) {
      operator_delete(local_378._M_dataplus._M_p);
    }
    std::operator+(&local_338," extends ",&local_2d0);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_338);
    psVar9 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_378.field_2._M_allocated_capacity = *psVar9;
      local_378.field_2._8_8_ = plVar6[3];
      local_378._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_378.field_2._M_allocated_capacity = *psVar9;
      local_378._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_378._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_2b0,(string *)&local_378);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != paVar2) {
      operator_delete(local_378._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p);
    }
  }
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  pcVar3 = (this->super_t_oop_generator).super_t_generator.service_name_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_378,pcVar3,
             pcVar3 + (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length
            );
  std::__cxx11::string::append((char *)&local_378);
  ptVar11 = (t_dart_generator *)
            (this->super_t_oop_generator).super_t_generator.service_name_._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,ptVar11,
             (long)&(ptVar11->super_t_oop_generator).super_t_generator._vptr_t_generator +
             (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length);
  get_file_name(&local_50,ptVar11,&local_70);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_378._M_dataplus._M_p,
             local_378._M_dataplus._M_p + local_378._M_string_length);
  export_class_to_library(this,&local_50,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  os = &this->f_service_;
  poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"class ",6);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_378._M_dataplus._M_p,local_378._M_string_length);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_2b0,local_2a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," implements ",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,(this->super_t_oop_generator).super_t_generator.service_name_._M_dataplus._M_p,
             (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," ","");
  scope_up(this,(ostream *)os,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_378._M_dataplus._M_p,local_378._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"(TProtocol iprot, [TProtocol oprot = null])",0x2b);
  if (local_2d0._M_string_length == 0) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," ","");
    scope_up(this,(ostream *)os,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_iprot = iprot;",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"_oprot = (oprot == null) ? iprot : oprot;",0x29);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_dataplus._M_p + ::endl_abi_cxx11_._M_string_length);
    scope_down(this,(ostream *)os,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
  }
  else {
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,": super(iprot, oprot);",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_2d0._M_string_length == 0) {
    poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"TProtocol _iprot;",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,endl2_abi_cxx11_._M_dataplus._M_p,endl2_abi_cxx11_._M_string_length);
    poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"TProtocol get iprot => _iprot;",0x1e)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,endl2_abi_cxx11_._M_dataplus._M_p,endl2_abi_cxx11_._M_string_length);
    poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"TProtocol _oprot;",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,endl2_abi_cxx11_._M_dataplus._M_p,endl2_abi_cxx11_._M_string_length);
    poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"TProtocol get oprot => _oprot;",0x1e)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,endl2_abi_cxx11_._M_dataplus._M_p,endl2_abi_cxx11_._M_string_length);
    poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"int _seqid = 0;",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,endl2_abi_cxx11_._M_dataplus._M_p,endl2_abi_cxx11_._M_string_length);
    poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"int get seqid => _seqid;",0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,endl2_abi_cxx11_._M_dataplus._M_p,endl2_abi_cxx11_._M_string_length);
    poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"int nextSeqid() => ++_seqid;",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,endl2_abi_cxx11_._M_dataplus._M_p,endl2_abi_cxx11_._M_string_length);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_208,&tservice->functions_)
  ;
  if (local_208.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_208.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar13 = local_208.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
      function_signature_abi_cxx11_(&local_338,this,*pptVar13);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_338._M_dataplus._M_p,local_338._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," async",6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p);
      }
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130," ","");
      scope_up(this,(ostream *)os,&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      ptVar8 = *pptVar13;
      ptVar4 = ptVar8->arglist_;
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      ptVar11 = (t_dart_generator *)(ptVar8->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_150,ptVar11,
                 (long)&(ptVar11->super_t_oop_generator).super_t_generator._vptr_t_generator +
                 (ptVar8->name_)._M_string_length);
      get_args_class_name(&local_338,ptVar11,&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"oprot.writeMessageBegin(new TMessage(\"",0x26);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,((*pptVar13)->name_)._M_dataplus._M_p,
                          ((*pptVar13)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\", ",3);
      pcVar10 = "TMessageType.CALL";
      if ((*pptVar13)->oneway_ != false) {
        pcVar10 = "TMessageType.ONEWAY";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,pcVar10,(ulong)(*pptVar13)->oneway_ * 2 + 0x11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", nextSeqid()));",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_338._M_dataplus._M_p,local_338._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," args = new ",0xc);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_338._M_dataplus._M_p,local_338._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"();",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      local_318 = pptVar13;
      for (pptVar12 = (ptVar4->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          pptVar12 !=
          (ptVar4->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar12 = pptVar12 + 1) {
        pcVar3 = ((*pptVar12)->name_)._M_dataplus._M_p;
        local_2f0 = &local_2e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f0,pcVar3,pcVar3 + ((*pptVar12)->name_)._M_string_length);
        paVar2 = local_2f0;
        iVar5 = tolower((int)local_2f0->_M_local_buf[0]);
        paVar2->_M_local_buf[0] = (char)iVar5;
        local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
        if (local_2f0 == &local_2e0) {
          local_398.field_2._8_8_ = local_2e0._8_8_;
        }
        else {
          local_398._M_dataplus._M_p = (pointer)local_2f0;
        }
        local_398.field_2._M_allocated_capacity._1_7_ = local_2e0._M_allocated_capacity._1_7_;
        local_398.field_2._M_local_buf[0] = local_2e0._M_local_buf[0];
        local_398._M_string_length = local_2e8;
        local_2e8 = 0;
        local_2e0._M_local_buf[0] = '\0';
        local_2f0 = &local_2e0;
        poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"args.",5);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_398._M_dataplus._M_p,local_398._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_398._M_dataplus._M_p,local_398._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_dataplus._M_p != &local_398.field_2) {
          operator_delete(local_398._M_dataplus._M_p);
        }
      }
      poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
      pptVar13 = local_318;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"args.write(oprot);",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"oprot.writeMessageEnd();",0x18);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,endl2_abi_cxx11_._M_dataplus._M_p,endl2_abi_cxx11_._M_string_length);
      poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"await oprot.transport.flush();",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,endl2_abi_cxx11_._M_dataplus._M_p,endl2_abi_cxx11_._M_string_length);
      if ((*pptVar13)->oneway_ == false) {
        poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"TMessage msg = iprot.readMessageBegin();",0x28);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"if (msg.type == TMessageType.EXCEPTION)",0x27);
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_170," ","");
        scope_up(this,(ostream *)os,&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
        poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"TApplicationError error = TApplicationError.read(iprot);",0x38);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"iprot.readMessageEnd();",0x17);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"throw error;",0xc);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_228,endl2_abi_cxx11_._M_dataplus._M_p,
                   endl2_abi_cxx11_._M_dataplus._M_p + endl2_abi_cxx11_._M_string_length);
        scope_down(this,(ostream *)os,&local_228);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p);
        }
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        ptVar11 = (t_dart_generator *)((*pptVar13)->name_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_190,ptVar11,
                   (long)&(ptVar11->super_t_oop_generator).super_t_generator._vptr_t_generator +
                   ((*pptVar13)->name_)._M_string_length);
        get_result_class_name(&local_398,ptVar11,&local_190);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p);
        }
        poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_398._M_dataplus._M_p,local_398._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," result = new ",0xe);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_398._M_dataplus._M_p,local_398._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"();",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"result.read(iprot);",0x13);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"iprot.readMessageEnd();",0x17);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        iVar5 = (*((*pptVar13)->returntype_->super_t_doc)._vptr_t_doc[4])();
        if ((char)iVar5 == '\0') {
          poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (result.",0xb);
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          ptVar11 = (t_dart_generator *)0x3a4e44;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"success","");
          generate_isset_check(&local_358,ptVar11,&local_1b0);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_358._M_dataplus._M_p,local_358._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p);
          }
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0," ","");
          scope_up(this,(ostream *)os,&local_1d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p);
          }
          poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"return result.success;",0x16);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_248,endl2_abi_cxx11_._M_dataplus._M_p,
                     endl2_abi_cxx11_._M_dataplus._M_p + endl2_abi_cxx11_._M_string_length);
          scope_down(this,(ostream *)os,&local_248);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p);
          }
        }
        ptVar8 = *pptVar13;
        local_290 = ptVar8->xceptions_;
        pptVar12 = (local_290->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        if (pptVar12 !=
            (local_290->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            pcVar3 = ((*pptVar12)->name_)._M_dataplus._M_p;
            local_310 = &local_300;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_310,pcVar3,pcVar3 + ((*pptVar12)->name_)._M_string_length);
            paVar2 = local_310;
            iVar5 = tolower((int)local_310->_M_local_buf[0]);
            paVar2->_M_local_buf[0] = (char)iVar5;
            local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
            if (local_310 == &local_300) {
              local_358.field_2._8_8_ = local_300._8_8_;
            }
            else {
              local_358._M_dataplus._M_p = (pointer)local_310;
            }
            local_358.field_2._M_allocated_capacity._1_7_ = local_300._M_allocated_capacity._1_7_;
            local_358.field_2._M_local_buf[0] = local_300._M_local_buf[0];
            local_358._M_string_length = local_308;
            local_308 = 0;
            local_300._M_local_buf[0] = '\0';
            local_310 = &local_300;
            poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (result.",0xb);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,local_358._M_dataplus._M_p,local_358._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," != null)",9);
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0," ","");
            scope_up(this,(ostream *)os,&local_1f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p);
            }
            poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"throw result.",0xd);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,local_358._M_dataplus._M_p,local_358._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_268,::endl_abi_cxx11_._M_dataplus._M_p,
                       ::endl_abi_cxx11_._M_dataplus._M_p + ::endl_abi_cxx11_._M_string_length);
            scope_down(this,(ostream *)os,&local_268);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_dataplus._M_p != &local_268.field_2) {
              operator_delete(local_268._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._M_dataplus._M_p != &local_358.field_2) {
              operator_delete(local_358._M_dataplus._M_p);
            }
            pptVar12 = pptVar12 + 1;
          } while (pptVar12 !=
                   (local_290->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
          ptVar8 = *local_318;
        }
        iVar5 = (*(ptVar8->returntype_->super_t_doc)._vptr_t_doc[4])();
        pptVar13 = local_318;
        if ((char)iVar5 == '\0') {
          poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"throw new TApplicationError(TApplicationErrorType.MISSING_RESULT, \"",
                     0x43);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,((*pptVar13)->name_)._M_dataplus._M_p,
                              ((*pptVar13)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7," failed: unknown result\");",0x1a);
        }
        else {
          poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"return;",7);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_dataplus._M_p != &local_398.field_2) {
          operator_delete(local_398._M_dataplus._M_p);
        }
      }
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_288,endl2_abi_cxx11_._M_dataplus._M_p,
                 endl2_abi_cxx11_._M_dataplus._M_p + endl2_abi_cxx11_._M_string_length);
      scope_down(this,(ostream *)os,&local_288);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p);
      }
      pptVar13 = pptVar13 + 1;
    } while (pptVar13 !=
             local_208.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,endl2_abi_cxx11_._M_dataplus._M_p,
             endl2_abi_cxx11_._M_dataplus._M_p + endl2_abi_cxx11_._M_string_length);
  scope_down(this,(ostream *)os,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_208.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p);
  }
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_dart_generator::generate_service_client(t_service* tservice) {
  string extends = "";
  string extends_client = "";
  if (tservice->get_extends() != nullptr) {
    extends = get_ttype_class_name(tservice->get_extends());
    extends_client = " extends " + extends + "Client";
  }

  string class_name = service_name_ + "Client";
  export_class_to_library(get_file_name(service_name_), class_name);
  indent(f_service_) << "class " << class_name << extends_client
                     << " implements " << service_name_;
  scope_up(f_service_);
  f_service_ << endl;

  indent(f_service_) << class_name << "(TProtocol iprot, [TProtocol oprot = null])";

  if (!extends.empty()) {
    indent_up();
    f_service_ << endl;
    indent(f_service_) << ": super(iprot, oprot);" << endl;
    indent_down();
  } else {
    scope_up(f_service_);
    indent(f_service_) << "_iprot = iprot;" << endl;
    indent(f_service_) << "_oprot = (oprot == null) ? iprot : oprot;" << endl;
    scope_down(f_service_);
  }
  f_service_ << endl;

  if (extends.empty()) {
    indent(f_service_) << "TProtocol _iprot;" << endl2;
    indent(f_service_) << "TProtocol get iprot => _iprot;" << endl2;
    indent(f_service_) << "TProtocol _oprot;" << endl2;
    indent(f_service_) << "TProtocol get oprot => _oprot;" << endl2;
    indent(f_service_) << "int _seqid = 0;" << endl2;
    indent(f_service_) << "int get seqid => _seqid;" << endl2;
    indent(f_service_) << "int nextSeqid() => ++_seqid;" << endl2;
  }

  // Generate client method implementations
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    // Open function
    indent(f_service_) << function_signature(*f_iter) << " async";
    scope_up(f_service_);

    // Get the struct of function call params
    t_struct* arg_struct = (*f_iter)->get_arglist();

    string argsname = get_args_class_name((*f_iter)->get_name());
    vector<t_field*>::const_iterator fld_iter;
    const vector<t_field*>& fields = arg_struct->get_members();

    // Serialize the request
    indent(f_service_) << "oprot.writeMessageBegin(new TMessage(\"" << (*f_iter)->get_name() << "\", "
               << ((*f_iter)->is_oneway() ? "TMessageType.ONEWAY" : "TMessageType.CALL")
               << ", nextSeqid()));" << endl;
    indent(f_service_) << argsname << " args = new " << argsname << "();" << endl;

    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      string arg_field_name = get_member_name((*fld_iter)->get_name());
      indent(f_service_) << "args." << arg_field_name << " = "
                 << arg_field_name << ";" << endl;
    }

    indent(f_service_) << "args.write(oprot);" << endl;
    indent(f_service_) << "oprot.writeMessageEnd();" << endl2;

    indent(f_service_) << "await oprot.transport.flush();" << endl2;

    if (!(*f_iter)->is_oneway()) {
      indent(f_service_) << "TMessage msg = iprot.readMessageBegin();" << endl;
      indent(f_service_) << "if (msg.type == TMessageType.EXCEPTION)";
      scope_up(f_service_);
      indent(f_service_) << "TApplicationError error = TApplicationError.read(iprot);" << endl;
      indent(f_service_) << "iprot.readMessageEnd();" << endl;
      indent(f_service_) << "throw error;" << endl;
      scope_down(f_service_, endl2);

      string result_class = get_result_class_name((*f_iter)->get_name());
      indent(f_service_) << result_class << " result = new " << result_class << "();" << endl;
      indent(f_service_) << "result.read(iprot);" << endl;
      indent(f_service_) << "iprot.readMessageEnd();" << endl;

      // Careful, only return _result if not a void function
      if (!(*f_iter)->get_returntype()->is_void()) {
        indent(f_service_) << "if (result." << generate_isset_check("success") << ")";
        scope_up(f_service_);
        indent(f_service_) << "return result.success;" << endl;
        scope_down(f_service_, endl2);
      }

      t_struct* xs = (*f_iter)->get_xceptions();
      const std::vector<t_field*>& xceptions = xs->get_members();
      vector<t_field*>::const_iterator x_iter;
      for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
        string result_field_name = get_member_name((*x_iter)->get_name());
        indent(f_service_) << "if (result." << result_field_name << " != null)";
        scope_up(f_service_);
        indent(f_service_) << "throw result." << result_field_name << ";" << endl;
        scope_down(f_service_);
      }

      // If you get here it's an exception, unless a void function
      if ((*f_iter)->get_returntype()->is_void()) {
        indent(f_service_) << "return;" << endl;
      } else {
        indent(f_service_) << "throw new TApplicationError(TApplicationErrorType.MISSING_RESULT, \""
                   << (*f_iter)->get_name() << " failed: unknown result\");" << endl;
      }
    }

    scope_down(f_service_, endl2);
  }

  scope_down(f_service_, endl2);
}